

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_BasicRepeatedTest_SetOption_Test::TestBody
          (ComparisonTest_BasicRepeatedTest_SetOption_Test *this)

{
  RepeatedField<int> *this_00;
  RepeatedField<int> *this_01;
  anon_union_816_1_493b367e_for_TestAllTypes_11 aVar1;
  int iVar2;
  char *message;
  bool bVar3;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  TestAllTypes *local_38;
  
  (this->super_ComparisonTest).repeated_field_as_set_ = true;
  this_00 = &(this->super_ComparisonTest).proto1_.field_0._impl_.repeated_int32_;
  aVar1 = (this->super_ComparisonTest).proto1_.field_0;
  if (((undefined1  [816])aVar1 & (undefined1  [816])0x4) != (undefined1  [816])0x0) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  bVar3 = ((undefined1  [816])aVar1 & (undefined1  [816])0x4) == (undefined1  [816])0x0;
  protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar3);
  iVar2 = protobuf::internal::SooRep::size(&this_00->soo_rep_,bVar3);
  if ((iVar2 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  RepeatedField<int>::set_size
            (this_00,((undefined1  [816])aVar1 & (undefined1  [816])0x4) == (undefined1  [816])0x0,0
            );
  this_01 = &(this->super_ComparisonTest).proto2_.field_0._impl_.repeated_int32_;
  aVar1 = (this->super_ComparisonTest).proto2_.field_0;
  if (((undefined1  [816])aVar1 & (undefined1  [816])0x4) != (undefined1  [816])0x0) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  local_38 = &(this->super_ComparisonTest).proto1_;
  bVar3 = ((undefined1  [816])aVar1 & (undefined1  [816])0x4) == (undefined1  [816])0x0;
  protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar3);
  iVar2 = protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar3);
  if ((iVar2 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  RepeatedField<int>::set_size
            (this_01,((undefined1  [816])aVar1 & (undefined1  [816])0x4) == (undefined1  [816])0x0,0
            );
  RepeatedField<int>::Add(this_00,0x1f5);
  RepeatedField<int>::Add(this_00,0x1f6);
  RepeatedField<int>::Add(this_00,0x1f7);
  RepeatedField<int>::Add(this_00,500);
  RepeatedField<int>::Add(this_00,500);
  RepeatedField<int>::Add(this_01,500);
  RepeatedField<int>::Add(this_01,0x1fd);
  RepeatedField<int>::Add(this_01,0x1f7);
  RepeatedField<int>::Add(this_01,0x1f6);
  RepeatedField<int>::Add(this_01,0x1f8);
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_58,this,&local_38->super_Message,
             &(this->super_ComparisonTest).proto2_.super_Message);
  testing::internal::CmpHelperEQ<char[229],std::__cxx11::string>
            (local_68,
             "\"moved: repeated_int32[1] -> repeated_int32[3] : 502\\n\" \"moved: repeated_int32[3] -> repeated_int32[0] : 500\\n\" \"added: repeated_int32[1]: 509\\n\" \"added: repeated_int32[4]: 504\\n\" \"deleted: repeated_int32[0]: 501\\n\" \"deleted: repeated_int32[4]: 500\\n\""
             ,"Run()",(char (*) [229])
                      "moved: repeated_int32[1] -> repeated_int32[3] : 502\nmoved: repeated_int32[3] -> repeated_int32[0] : 500\nadded: repeated_int32[1]: 509\nadded: repeated_int32[4]: 504\ndeleted: repeated_int32[0]: 501\ndeleted: repeated_int32[4]: 500\n"
             ,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xd93,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, BasicRepeatedTest_SetOption) {
  repeated_field_as_set();
  proto1_.clear_repeated_int32();
  proto2_.clear_repeated_int32();

  proto1_.add_repeated_int32(501);
  proto1_.add_repeated_int32(502);
  proto1_.add_repeated_int32(503);
  proto1_.add_repeated_int32(500);
  proto1_.add_repeated_int32(500);

  proto2_.add_repeated_int32(500);
  proto2_.add_repeated_int32(509);
  proto2_.add_repeated_int32(503);
  proto2_.add_repeated_int32(502);
  proto2_.add_repeated_int32(504);

  EXPECT_EQ(
      "moved: repeated_int32[1] -> repeated_int32[3] : 502\n"
      "moved: repeated_int32[3] -> repeated_int32[0] : 500\n"
      "added: repeated_int32[1]: 509\n"
      "added: repeated_int32[4]: 504\n"
      "deleted: repeated_int32[0]: 501\n"
      "deleted: repeated_int32[4]: 500\n",
      Run());
}